

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

size_t aead_do_encrypt_final(ptls_aead_context_t *_ctx,void *_output)

{
  int iVar1;
  uchar *in_RSI;
  long *in_RDI;
  int ret;
  int blocklen;
  size_t tag_size;
  size_t off;
  uint8_t *output;
  aead_crypto_context_t *ctx;
  int local_34;
  long local_30;
  long local_28;
  uchar *local_20;
  long *local_18;
  
  local_28 = 0;
  local_30 = *(long *)(*in_RDI + 0x38);
  local_20 = in_RSI;
  local_18 = in_RDI;
  iVar1 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)in_RDI[8],in_RSI,&local_34);
  if (iVar1 == 0) {
    __assert_fail("ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                  ,0x3a0,"size_t aead_do_encrypt_final(ptls_aead_context_t *, void *)");
  }
  local_28 = local_34 + local_28;
  iVar1 = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)local_18[8],0x10,(int)local_30,local_20 + local_28);
  if (iVar1 != 0) {
    return local_30 + local_28;
  }
  __assert_fail("ret",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                ,0x3a3,"size_t aead_do_encrypt_final(ptls_aead_context_t *, void *)");
}

Assistant:

static size_t aead_do_encrypt_final(ptls_aead_context_t *_ctx, void *_output)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output;
    size_t off = 0, tag_size = ctx->super.algo->tag_size;
    int blocklen, ret;

    ret = EVP_EncryptFinal_ex(ctx->evp_ctx, output + off, &blocklen);
    assert(ret);
    off += blocklen;
    ret = EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_GET_TAG, (int)tag_size, output + off);
    assert(ret);
    off += tag_size;

    return off;
}